

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS ref_metric_interpolated_curvature(REF_GRID ref_grid)

{
  REF_NODE ref_node_00;
  uint uVar1;
  REF_DBL *metric_00;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT gradation;
  REF_DBL *metric;
  REF_NODE ref_node;
  REF_GRID ref_grid_local;
  
  ref_node_00 = ref_grid->node;
  if (ref_node_00->max * 6 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0x4fe,
           "ref_metric_interpolated_curvature","malloc metric of REF_DBL negative");
    ref_grid_local._4_4_ = 1;
  }
  else {
    metric_00 = (REF_DBL *)malloc((long)(ref_node_00->max * 6) << 3);
    if (metric_00 == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x4fe,"ref_metric_interpolated_curvature","malloc metric of REF_DBL NULL");
      ref_grid_local._4_4_ = 2;
    }
    else {
      ref_grid_local._4_4_ = ref_metric_from_curvature(metric_00,ref_grid);
      if (ref_grid_local._4_4_ == 0) {
        for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < 0x14;
            ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
          uVar1 = ref_metric_mixed_space_gradation(metric_00,ref_grid,-1.0,-1.0);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x501,"ref_metric_interpolated_curvature",(ulong)uVar1,"grad");
            return uVar1;
          }
        }
        ref_grid_local._4_4_ = ref_metric_to_node(metric_00,ref_node_00);
        if (ref_grid_local._4_4_ == 0) {
          if (metric_00 != (REF_DBL *)0x0) {
            free(metric_00);
          }
          ref_grid_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x503,"ref_metric_interpolated_curvature",(ulong)ref_grid_local._4_4_,"to node");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x4ff,"ref_metric_interpolated_curvature",(ulong)ref_grid_local._4_4_,"curve");
      }
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_metric_interpolated_curvature(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL *metric;
  REF_INT gradation;

  ref_malloc(metric, 6 * ref_node_max(ref_node), REF_DBL);
  RSS(ref_metric_from_curvature(metric, ref_grid), "curve");
  for (gradation = 0; gradation < 20; gradation++) {
    RSS(ref_metric_mixed_space_gradation(metric, ref_grid, -1.0, -1.0), "grad");
  }
  RSS(ref_metric_to_node(metric, ref_node), "to node");
  ref_free(metric);

  return REF_SUCCESS;
}